

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

bool __thiscall PClassPlayerPawn::GetPainFlash(PClassPlayerPawn *this,FName *type,PalEntry *color)

{
  Node *pNVar1;
  Node *pNVar2;
  
  do {
    pNVar1 = (this->PainFlashes).Nodes + ((this->PainFlashes).Size - 1 & type->Index);
    while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
      pNVar1 = pNVar2->Next;
      if ((pNVar2->Pair).Key.Index == type->Index) {
        color->field_0 = (pNVar2->Pair).Value.field_0;
        return true;
      }
    }
    this = dyn_cast<PClassPlayerPawn>((DObject *)(this->super_PClassActor).super_PClass.ParentClass)
    ;
  } while (this != (PClassPlayerPawn *)0x0);
  return false;
}

Assistant:

bool PClassPlayerPawn::GetPainFlash(FName type, PalEntry *color) const
{
	const PClassPlayerPawn *info = this;

	while (info != NULL)
	{
		const PalEntry *flash = info->PainFlashes.CheckKey(type);
		if (flash != NULL)
		{
			*color = *flash;
			return true;
		}
		// Try parent class
		info = dyn_cast<PClassPlayerPawn>(info->ParentClass);
	}
	return false;
}